

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

uint __thiscall
crnlib::mipmapped_texture::get_total_pixels_in_all_faces_and_mips(mipmapped_texture *this)

{
  vector<crnlib::mip_level_*> *pvVar1;
  mip_level *pmVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar4 = (ulong)(this->m_faces).m_size;
  if (uVar4 != 0) {
    pvVar1 = (this->m_faces).m_p;
    uVar5 = 0;
    uVar3 = 0;
    do {
      uVar6 = (ulong)pvVar1[uVar5].m_size;
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          pmVar2 = pvVar1[uVar5].m_p[uVar7];
          uVar3 = uVar3 + pmVar2->m_height * pmVar2->m_width;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar4);
    return uVar3;
  }
  return 0;
}

Assistant:

uint mipmapped_texture::get_total_pixels_in_all_faces_and_mips() const {
  uint total_pixels = 0;
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      total_pixels += m_faces[l][m]->get_total_pixels();

  return total_pixels;
}